

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

char * LLVMBC::to_string(Predicate pred)

{
  if (pred < (ICMP_SLT|FCMP_OGT)) {
    return &DAT_001c46b8 + *(int *)(&DAT_001c46b8 + (ulong)pred * 4);
  }
  return "???";
}

Assistant:

static const char *to_string(Instruction::Predicate pred)
{
	switch (pred)
	{
#define PRED(op, str)            \
	case Instruction::FCMP_##op: \
		return str
		PRED(FALSE, "false");
		PRED(OEQ, "oeq");
		PRED(OGT, "ogt");
		PRED(OGE, "oge");
		PRED(OLT, "olt");
		PRED(OLE, "ole");
		PRED(ONE, "one");
		PRED(ORD, "ord");
		PRED(UNO, "uno");
		PRED(UEQ, "ueq");
		PRED(UGT, "ugt");
		PRED(UGE, "uge");
		PRED(ULT, "ult");
		PRED(ULE, "ule");
		PRED(UNE, "une");
		PRED(TRUE, "true");
#undef PRED
#define PRED(op, str)            \
	case Instruction::ICMP_##op: \
		return str
		PRED(EQ, "eq");
		PRED(NE, "ne");
		PRED(UGT, "ugt");
		PRED(UGE, "uge");
		PRED(ULT, "ult");
		PRED(ULE, "ule");
		PRED(SGT, "sgt");
		PRED(SGE, "sge");
		PRED(SLT, "slt");
		PRED(SLE, "sle");
	}
#undef PRED
	return "???";
}